

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O3

void __thiscall Room::Room(Room *this)

{
  this->_vptr_Room = (_func_int **)&PTR___cxa_pure_virtual_00135168;
  (this->rstate0)._M_dataplus._M_p = (pointer)&(this->rstate0).field_2;
  (this->rstate0)._M_string_length = 0;
  (this->rstate0).field_2._M_local_buf[0] = '\0';
  (this->rstate1)._M_dataplus._M_p = (pointer)&(this->rstate1).field_2;
  (this->rstate1)._M_string_length = 0;
  (this->rstate1).field_2._M_local_buf[0] = '\0';
  (this->rstate2)._M_dataplus._M_p = (pointer)&(this->rstate2).field_2;
  (this->rstate2)._M_string_length = 0;
  (this->rstate2).field_2._M_local_buf[0] = '\0';
  (this->rsdesc1)._M_dataplus._M_p = (pointer)&(this->rsdesc1).field_2;
  (this->rsdesc1)._M_string_length = 0;
  (this->rsdesc1).field_2._M_local_buf[0] = '\0';
  (this->rsdesc2)._M_dataplus._M_p = (pointer)&(this->rsdesc2).field_2;
  (this->rsdesc2)._M_string_length = 0;
  (this->rsdesc2).field_2._M_local_buf[0] = '\0';
  (this->rsdesc3)._M_dataplus._M_p = (pointer)&(this->rsdesc3).field_2;
  (this->rsdesc3)._M_string_length = 0;
  (this->rsdesc3).field_2._M_local_buf[0] = '\0';
  (this->rsdesc4)._M_dataplus._M_p = (pointer)&(this->rsdesc4).field_2;
  (this->rsdesc4)._M_string_length = 0;
  (this->rsdesc4).field_2._M_local_buf[0] = '\0';
  (this->roomName)._M_dataplus._M_p = (pointer)&(this->roomName).field_2;
  (this->roomName)._M_string_length = 0;
  (this->roomName).field_2._M_local_buf[0] = '\0';
  (this->displayName)._M_dataplus._M_p = (pointer)&(this->displayName).field_2;
  (this->displayName)._M_string_length = 0;
  (this->displayName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Room::Room(){}